

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
* anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
             *__return_storage_ptr__,test_trie *index,transaction_type *transaction,string *key,
            string *value)

{
  string *value_local;
  string *key_local;
  transaction_type *transaction_local;
  test_trie *index_local;
  
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,std::__cxx11::string,void>
            (__return_storage_ptr__,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
              *)index,&transaction->super_transaction_base,key,value);
  return __return_storage_ptr__;
}

Assistant:

auto GenericIndexFixture::insert_or_assign (test_trie & index, transaction_type & transaction,
                                                std::string const & key, std::string const & value)
        -> std::pair<test_trie::iterator, bool> {
        return index.insert_or_assign (transaction, key, value);
    }